

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL> __thiscall
slang::ast::RandSeqProductionSymbol::getRules(RandSeqProductionSymbol *this)

{
  ParentList *pPVar1;
  SyntaxNode *pSVar2;
  long lVar3;
  specific_symbol_iterator<slang::ast::StatementBlockSymbol> ruleBlock;
  int iVar4;
  RsRuleSyntax *syntax;
  undefined4 extraout_var;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX;
  size_t extraout_RDX_00;
  Compilation *dst;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_(std::ranges::subrange_kind)0>
  sVar5;
  specific_symbol_iterator<slang::ast::StatementBlockSymbol> blockIt;
  const_iterator __begin3;
  SmallVector<slang::ast::RandSeqProductionSymbol::Rule,_8UL> buffer;
  specific_symbol_iterator<slang::ast::StatementBlockSymbol> local_320;
  iterator_base<const_slang::syntax::RsRuleSyntax_*> local_318;
  ASTContext local_308;
  Rule local_2d0;
  SmallVectorBase<slang::ast::RandSeqProductionSymbol::Rule> local_288 [6];
  
  if ((this->rules).
      super__Optional_base<std::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>,_true,_true>
      ._M_payload.
      super__Optional_payload_base<std::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>_>
      ._M_engaged == false) {
    pSVar2 = (this->super_Symbol).originatingSyntax;
    local_308.scope.ptr = &this->super_Scope;
    local_308.lookupIndex = 0xffffffff;
    local_308.flags.m_bits = 0;
    local_308.instanceOrProc = (Symbol *)0x0;
    local_308.firstTempVar = (TempVarSymbol *)0x0;
    local_308.randomizeDetails = (RandomizeDetails *)0x0;
    local_308.assertionInstance = (AssertionInstanceDetails *)0x0;
    sVar5 = Scope::membersOfType<slang::ast::StatementBlockSymbol>(local_308.scope.ptr);
    local_320 = sVar5._M_begin.current;
    local_288[0].data_ = (pointer)local_288[0].firstElement;
    local_288[0].len = 0;
    src = (EVP_PKEY_CTX *)&local_320;
    pPVar1 = (ParentList *)(pSVar2 + 3);
    local_318.index = 0;
    local_288[0].cap = 8;
    lVar3 = *(long *)(pSVar2 + 5);
    local_318.list = pPVar1;
    for (; (local_318.list != pPVar1 || (local_318.index != lVar3 + 1U >> 1));
        local_318.index = local_318.index + 1) {
      syntax = slang::syntax::SeparatedSyntaxList<slang::syntax::RsRuleSyntax>::
               iterator_base<const_slang::syntax::RsRuleSyntax_*>::dereference(&local_318);
      ruleBlock.current = local_320.current;
      Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>::increment(&local_320);
      createRule(&local_2d0,syntax,&local_308,(StatementBlockSymbol *)ruleBlock.current);
      SmallVectorBase<slang::ast::RandSeqProductionSymbol::Rule>::
      emplace_back<slang::ast::RandSeqProductionSymbol::Rule>(local_288,&local_2d0);
      src = extraout_RDX;
    }
    dst = (local_308.scope.ptr)->compilation;
    iVar4 = SmallVectorBase<slang::ast::RandSeqProductionSymbol::Rule>::copy
                      (local_288,(EVP_PKEY_CTX *)dst,src);
    if ((this->rules).
        super__Optional_base<std::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>,_true,_true>
        ._M_payload.
        super__Optional_payload_base<std::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>_>
        ._M_engaged == false) {
      (this->rules).
      super__Optional_base<std::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>,_true,_true>
      ._M_payload.
      super__Optional_payload_base<std::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>_>
      ._M_engaged = true;
    }
    (this->rules).
    super__Optional_base<std::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>,_true,_true>
    ._M_payload.
    super__Optional_payload_base<std::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>_>
    ._M_payload._M_value._M_ptr = (pointer)CONCAT44(extraout_var,iVar4);
    (this->rules).
    super__Optional_base<std::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>,_true,_true>
    ._M_payload.
    super__Optional_payload_base<std::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>_>
    ._M_payload._M_value._M_extent._M_extent_value = extraout_RDX_00;
    SmallVectorBase<slang::ast::RandSeqProductionSymbol::Rule>::cleanup
              (local_288,(EVP_PKEY_CTX *)dst);
  }
  return (this->rules).
         super__Optional_base<std::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>,_true,_true>
         ._M_payload.
         super__Optional_payload_base<std::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>_>
         ._M_payload._M_value;
}

Assistant:

std::span<const RandSeqProductionSymbol::Rule> RandSeqProductionSymbol::getRules() const {
    if (!rules) {
        auto syntax = getSyntax();
        SLANG_ASSERT(syntax);

        ASTContext context(*this, LookupLocation::max);

        auto blocks = membersOfType<StatementBlockSymbol>();
        auto blockIt = blocks.begin();

        SmallVector<Rule, 8> buffer;
        for (auto rule : syntax->as<ProductionSyntax>().rules) {
            SLANG_ASSERT(blockIt != blocks.end());
            buffer.push_back(createRule(*rule, context, *blockIt++));
        }

        rules = buffer.copy(context.getCompilation());
    }
    return *rules;
}